

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

void __thiscall rpc_tests::rpc_rawsign::test_method(rpc_rawsign *this)

{
  long lVar1;
  string args;
  string args_00;
  string args_01;
  bool bVar2;
  string *__str;
  UniValue *pUVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  string_view key;
  const_string file_00;
  string_view key_00;
  const_string msg;
  const_string msg_00;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffcec;
  undefined4 uVar7;
  check_type cVar8;
  undefined8 in_stack_fffffffffffffcf8;
  undefined8 in_stack_fffffffffffffd00;
  char *local_2f0;
  char *local_2e8;
  allocator<char> local_2d9;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string privkey2;
  string privkey1;
  string notsigned;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [4];
  string prevout;
  UniValue r;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  r.val._M_dataplus._M_p = (pointer)&r.val.field_2;
  r.val._M_string_length = 0;
  r.val.field_2._M_local_buf[0] = '\0';
  r.typ = VNULL;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  r.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  r.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prevout,
             "[{\"txid\":\"b4cc287e58f87cdae59417329f710f3ecd75a4ee1d2872b7248f50977c8493f3\",\"vout\":1,\"scriptPubKey\":\"a914b10c9df5f7edf436c697f02f1efdba4cf399615187\",\"redeemScript\":\"512103debedc17b3df2badbcdd86d5feb4562b86fe182e5998abd8bcd4f122c6155b1b21027e940bb73ab8732bfdf7f9216ecefca5b94d6df834e77e108f68e66f126044c052ae\"}]"
             ,(allocator<char> *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&privkey2,"createrawtransaction ",(allocator<char> *)&local_1c8);
  std::operator+(&privkey1,&privkey2,&prevout);
  std::operator+(&notsigned,&privkey1," ");
  std::operator+(&local_128,&notsigned,"{\"3HqAe9LtNBjnsfM4CyYaWTnvCaUYT7v4oZ\":11}");
  args._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffcec;
  args._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffce8;
  args._M_string_length = (size_type)_cVar8;
  args.field_2._M_allocated_capacity = in_stack_fffffffffffffcf8;
  args.field_2._8_8_ = in_stack_fffffffffffffd00;
  RPCTestingSetup::CallRPC((UniValue *)local_108,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  UniValue::operator=(&r,(UniValue *)local_108);
  UniValue::~UniValue((UniValue *)local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&notsigned);
  std::__cxx11::string::~string((string *)&privkey1);
  std::__cxx11::string::~string((string *)&privkey2);
  __str = UniValue::get_str_abi_cxx11_(&r);
  std::__cxx11::string::string((string *)&notsigned,__str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&privkey1,"\"KzsXybp9jX64P5ekX1KUxRQ79Jht9uzW7LorgwE65i5rWACL6LQe\"",
             (allocator<char> *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&privkey2,"\"Kyhdf5LuKTRx4ge69ybABsiUAWjVRK4XGxAKk2FQLp2HjGMy87Z4\"",
             (allocator<char> *)local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"signrawtransactionwithkey ",(allocator<char> *)&local_248);
  std::operator+(&local_1e8,&local_208,&notsigned);
  std::operator+(&local_1c8,&local_1e8," [] ");
  std::operator+(&local_1a8,&local_1c8,&prevout);
  args_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffcec;
  args_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffce8;
  args_00._M_string_length = (size_type)_cVar8;
  args_00.field_2._M_allocated_capacity = in_stack_fffffffffffffcf8;
  args_00.field_2._8_8_ = in_stack_fffffffffffffd00;
  RPCTestingSetup::CallRPC((UniValue *)local_108,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  UniValue::operator=(&r,(UniValue *)local_108);
  UniValue::~UniValue((UniValue *)local_108);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcf;
  file.m_begin = (iterator)&local_2b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c8,msg);
  pUVar3 = UniValue::get_obj(&r);
  key._M_str = "complete";
  key._M_len = 8;
  pUVar3 = UniValue::find_value(pUVar3,key);
  bVar2 = UniValue::get_bool(pUVar3);
  local_1c8._M_dataplus._M_p._0_1_ = !bVar2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = "r.get_obj().find_value(\"complete\").get_bool() == false";
  local_1e8._M_string_length = 0xbd23aa;
  local_108[8] = false;
  local_108._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2d0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_f0[0]._0_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c8,(lazy_ostream *)local_108,1,0,WARN,_cVar8,
             (size_t)&local_2d8,0xcf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1c8.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"signrawtransactionwithkey ",&local_2d9);
  std::operator+(&local_288,&local_2a8,&notsigned);
  std::operator+(&local_268,&local_288," [");
  std::operator+(&local_248,&local_268,&privkey1);
  std::operator+(&local_208,&local_248,",");
  std::operator+(&local_1e8,&local_208,&privkey2);
  std::operator+(&local_1c8,&local_1e8,"] ");
  std::operator+(&local_228,&local_1c8,&prevout);
  args_01._M_dataplus._M_p._4_4_ = uVar7;
  args_01._M_dataplus._M_p._0_4_ = uVar6;
  args_01._M_string_length = (size_type)_cVar8;
  args_01.field_2._M_allocated_capacity = in_stack_fffffffffffffcf8;
  args_01.field_2._8_8_ = in_stack_fffffffffffffd00;
  RPCTestingSetup::CallRPC((UniValue *)local_108,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  UniValue::operator=(&r,(UniValue *)local_108);
  UniValue::~UniValue((UniValue *)local_108);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_2e8 = "";
  file_00.m_end = (iterator)0xd1;
  file_00.m_begin = (iterator)&local_2f0;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffffd00,msg_00);
  pUVar3 = UniValue::get_obj(&r);
  key_00._M_str = "complete";
  key_00._M_len = 8;
  pUVar3 = UniValue::find_value(pUVar3,key_00);
  local_1c8._M_dataplus._M_p._0_1_ = UniValue::get_bool(pUVar3);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1e8._M_dataplus._M_p = "r.get_obj().find_value(\"complete\").get_bool() == true";
  local_1e8._M_string_length = 0xbd23e0;
  local_108[8] = false;
  local_108._0_8_ = &PTR__lazy_ostream_011481f0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0[0]._0_8_ = &local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1c8,(lazy_ostream *)local_108,1,0,WARN,0xbd0f7e,
             (size_t)&stack0xfffffffffffffcf0,0xd1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1c8.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&privkey2);
  std::__cxx11::string::~string((string *)&privkey1);
  std::__cxx11::string::~string((string *)&notsigned);
  std::__cxx11::string::~string((string *)&prevout);
  UniValue::~UniValue(&r);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_rawsign)
{
    UniValue r;
    // input is a 1-of-2 multisig (so is output):
    std::string prevout =
      "[{\"txid\":\"b4cc287e58f87cdae59417329f710f3ecd75a4ee1d2872b7248f50977c8493f3\","
      "\"vout\":1,\"scriptPubKey\":\"a914b10c9df5f7edf436c697f02f1efdba4cf399615187\","
      "\"redeemScript\":\"512103debedc17b3df2badbcdd86d5feb4562b86fe182e5998abd8bcd4f122c6155b1b21027e940bb73ab8732bfdf7f9216ecefca5b94d6df834e77e108f68e66f126044c052ae\"}]";
    r = CallRPC(std::string("createrawtransaction ")+prevout+" "+
      "{\"3HqAe9LtNBjnsfM4CyYaWTnvCaUYT7v4oZ\":11}");
    std::string notsigned = r.get_str();
    std::string privkey1 = "\"KzsXybp9jX64P5ekX1KUxRQ79Jht9uzW7LorgwE65i5rWACL6LQe\"";
    std::string privkey2 = "\"Kyhdf5LuKTRx4ge69ybABsiUAWjVRK4XGxAKk2FQLp2HjGMy87Z4\"";
    r = CallRPC(std::string("signrawtransactionwithkey ")+notsigned+" [] "+prevout);
    BOOST_CHECK(r.get_obj().find_value("complete").get_bool() == false);
    r = CallRPC(std::string("signrawtransactionwithkey ")+notsigned+" ["+privkey1+","+privkey2+"] "+prevout);
    BOOST_CHECK(r.get_obj().find_value("complete").get_bool() == true);
}